

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cpp
# Opt level: O3

int32_t cpu_get_num_math(void)

{
  long lVar1;
  uint *puVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  int32_t iVar6;
  long lVar7;
  pthread_t __th;
  int result;
  uint uVar8;
  cpu_set_t affinity;
  cpu_set_t local_128;
  cpu_set_t local_a8;
  
  lVar7 = sysconf(0x54);
  if ((int)lVar7 < 1) {
    iVar6 = cpu_get_num_physical_cores();
    return iVar6;
  }
  lVar1 = cpuid_Extended_Feature_Enumeration_info(7);
  if ((short)*(undefined4 *)(lVar1 + 8) < 0) {
    __th = pthread_self();
    iVar4 = pthread_getaffinity_np(__th,0x80,&local_a8);
    if (iVar4 == 0) {
      uVar8 = 0;
      iVar4 = 0;
      do {
        local_128.__bits[0xe] = 0;
        local_128.__bits[0xf] = 0;
        local_128.__bits[0xc] = 0;
        local_128.__bits[0xd] = 0;
        local_128.__bits[10] = 0;
        local_128.__bits[0xb] = 0;
        local_128.__bits[8] = 0;
        local_128.__bits[9] = 0;
        local_128.__bits[6] = 0;
        local_128.__bits[7] = 0;
        local_128.__bits[4] = 0;
        local_128.__bits[5] = 0;
        local_128.__bits[2] = 0;
        local_128.__bits[3] = 0;
        local_128.__bits[0] = 0;
        local_128.__bits[1] = 0;
        if (uVar8 < 0x400) {
          local_128.__bits[uVar8 >> 6] = local_128.__bits[uVar8 >> 6] | 1L << ((byte)uVar8 & 0x3f);
        }
        iVar5 = pthread_setaffinity_np(__th,0x80,&local_128);
        if (iVar5 != 0) {
          pthread_setaffinity_np(__th,0x80,&local_a8);
          goto LAB_0021aa8a;
        }
        puVar2 = (uint *)cpuid(0x1a);
        uVar3 = (uint)((*puVar2 & 0xff000000) != 0x20000000);
        iVar4 = iVar4 + uVar3;
        uVar8 = uVar8 + uVar3 + 1;
      } while ((int)uVar8 < (int)lVar7);
      pthread_setaffinity_np(__th,0x80,&local_a8);
      if (iVar4 != 0) {
        return iVar4;
      }
    }
  }
LAB_0021aa8a:
  iVar6 = cpu_get_num_physical_cores();
  return iVar6;
}

Assistant:

int32_t cpu_get_num_math() {
#if defined(__x86_64__) && defined(__linux__) && !defined(__ANDROID__)
    int n_cpu = sysconf(_SC_NPROCESSORS_ONLN);
    if (n_cpu < 1) {
        return cpu_get_num_physical_cores();
    }
    if (is_hybrid_cpu()) {
        cpu_set_t affinity;
        if (!pthread_getaffinity_np(pthread_self(), sizeof(affinity), &affinity)) {
            int result = cpu_count_math_cpus(n_cpu);
            pthread_setaffinity_np(pthread_self(), sizeof(affinity), &affinity);
            if (result > 0) {
                return result;
            }
        }
    }
#endif
    return cpu_get_num_physical_cores();
}